

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  GLFWmonitor *pGVar2;
  GLFWvidmode *pGVar3;
  int ypos;
  int xpos;
  undefined4 in_register_00000014;
  GLFWcursor *cursorHandle;
  char *pcVar4;
  int height;
  bool bVar5;
  double y_1;
  double x_1;
  int refreshRate;
  undefined8 local_28;
  undefined8 local_20;
  
  if (action != 1) {
    return;
  }
  if (0x4d < key) {
    switch(key) {
    case 0x4e:
switchD_00115475_caseD_4e:
      glfwSetInputMode(window,0x33001,0x34001);
      glfwGetCursorPos(window,&cursor_x,&cursor_y);
      pcVar4 = "(( cursor is normal ))";
      break;
    case 0x4f:
    case 0x51:
    case 0x53:
    case 0x55:
    case 0x56:
      return;
    case 0x50:
      glfwGetCursorPos(window,(double *)&local_20,(double *)&local_28);
      printf("Query before set: %f %f (%+f %+f)\n",CONCAT44(local_20._4_4_,(int)local_20),
             CONCAT44(local_28._4_4_,(int)local_28),
             (double)CONCAT44(local_20._4_4_,(int)local_20) - cursor_x,
             (double)CONCAT44(local_28._4_4_,(int)local_28) - cursor_y);
      cursor_x = (double)CONCAT44(local_20._4_4_,(int)local_20);
      cursor_y = (double)CONCAT44(local_28._4_4_,(int)local_28);
      glfwSetCursorPos(window,cursor_x,cursor_y);
      glfwGetCursorPos(window,(double *)&local_20,(double *)&local_28);
      printf("Query after set: %f %f (%+f %+f)\n",CONCAT44(local_20._4_4_,(int)local_20),
             CONCAT44(local_28._4_4_,(int)local_28),
             (double)CONCAT44(local_20._4_4_,(int)local_20) - cursor_x,
             (double)CONCAT44(local_28._4_4_,(int)local_28) - cursor_y);
      cursor_x = (double)CONCAT44(local_20._4_4_,(int)local_20);
      cursor_y = (double)CONCAT44(local_28._4_4_,(int)local_28);
      return;
    case 0x52:
      iVar1 = glfwRawMouseMotionSupported();
      if (iVar1 == 0) {
        return;
      }
      iVar1 = glfwGetInputMode(window,0x33005);
      if (iVar1 == 0) {
        glfwSetInputMode(window,0x33005,1);
        pcVar4 = "(( raw input is enabled ))";
      }
      else {
        glfwSetInputMode(window,0x33005,0);
        pcVar4 = "(( raw input is disabled ))";
      }
      break;
    case 0x54:
      bVar5 = track_cursor == 0;
      track_cursor = (int)bVar5;
      cursorHandle = tracking_cursor;
      if (bVar5) goto LAB_00115704;
      goto switchD_00115408_caseD_30;
    case 0x57:
      bVar5 = wait_events == 0;
      wait_events = (int)bVar5;
      pcVar4 = "poll";
      if (bVar5) {
        pcVar4 = "wait";
      }
      printf("(( %sing for events ))\n",pcVar4,CONCAT44(in_register_00000014,scancode));
      return;
    default:
      switch(key) {
      case 0x100:
        iVar1 = glfwGetInputMode(window,0x33001);
        if (iVar1 != 0x34003) {
          glfwSetWindowShouldClose(window,1);
          return;
        }
        goto switchD_00115475_caseD_4e;
      case 0x102:
      case 0x103:
      case 0x104:
      case 0x105:
      case 0x106:
      case 0x107:
        return;
      case 0x108:
        glfwGetWindowSize(window,(int *)&local_20,(int *)&local_28);
        glfwSetCursorPos(window,(double)((int)local_20 + -1),(double)((int)local_28 + -1));
        glfwGetCursorPos(window,&cursor_x,&cursor_y);
        return;
      case 0x109:
        glfwSetCursorPos(window,0.0,0.0);
        break;
      default:
        if (key != 300) {
          return;
        }
      case 0x101:
        if (mods != 4) {
          return;
        }
        pGVar2 = glfwGetWindowMonitor(window);
        if (pGVar2 == (GLFWmonitor *)0x0) {
          pGVar2 = glfwGetPrimaryMonitor();
          pGVar3 = glfwGetVideoMode(pGVar2);
          glfwGetWindowPos(window,&key_callback::x,&key_callback::y);
          glfwGetWindowSize(window,&key_callback::width,&key_callback::height);
          iVar1 = pGVar3->width;
          height = pGVar3->height;
          refreshRate = pGVar3->refreshRate;
          xpos = 0;
          ypos = 0;
        }
        else {
          refreshRate = 0;
          pGVar2 = (GLFWmonitor *)0x0;
          xpos = key_callback::x;
          ypos = key_callback::y;
          iVar1 = key_callback::width;
          height = key_callback::height;
        }
        glfwSetWindowMonitor(window,pGVar2,xpos,ypos,iVar1,height,refreshRate);
      }
      glfwGetCursorPos(window,&cursor_x,&cursor_y);
      return;
    }
    goto LAB_0011572b;
  }
  switch(key) {
  case 0x31:
    cursorHandle = standard_cursors[0];
    break;
  case 0x32:
    cursorHandle = standard_cursors[1];
    break;
  case 0x33:
    cursorHandle = standard_cursors[2];
    break;
  case 0x34:
    cursorHandle = standard_cursors[3];
    break;
  case 0x35:
    cursorHandle = standard_cursors[4];
    break;
  case 0x36:
    cursorHandle = standard_cursors[5];
    break;
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x42:
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x47:
    return;
  case 0x41:
    bVar5 = animate_cursor == 0;
    animate_cursor = (int)bVar5;
    if (bVar5) {
      return;
    }
  case 0x30:
switchD_00115408_caseD_30:
    cursorHandle = (GLFWcursor *)0x0;
    break;
  case 0x44:
    glfwSetInputMode(window,0x33001,0x34003);
    pcVar4 = "(( cursor is disabled ))";
    goto LAB_0011572b;
  case 0x48:
    glfwSetInputMode(window,0x33001,0x34002);
    pcVar4 = "(( cursor is hidden ))";
LAB_0011572b:
    puts(pcVar4);
    return;
  default:
    if (key != 0x20) {
      return;
    }
    swap_interval = 1 - swap_interval;
    printf("(( swap interval: %i ))\n",(ulong)(uint)swap_interval,
           CONCAT44(in_register_00000014,scancode));
    glfwSwapInterval(swap_interval);
    return;
  }
LAB_00115704:
  glfwSetCursor(window,cursorHandle);
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_A:
        {
            animate_cursor = !animate_cursor;
            if (!animate_cursor)
                glfwSetCursor(window, NULL);

            break;
        }

        case GLFW_KEY_ESCAPE:
        {
            if (glfwGetInputMode(window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
            {
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            }

            /* FALLTHROUGH */
        }

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_R:
            if (!glfwRawMouseMotionSupported())
                break;

            if (glfwGetInputMode(window, GLFW_RAW_MOUSE_MOTION))
            {
                glfwSetInputMode(window, GLFW_RAW_MOUSE_MOTION, GLFW_FALSE);
                printf("(( raw input is disabled ))\n");
            }
            else
            {
                glfwSetInputMode(window, GLFW_RAW_MOUSE_MOTION, GLFW_TRUE);
                printf("(( raw input is enabled ))\n");
            }
            break;

        case GLFW_KEY_SPACE:
            swap_interval = 1 - swap_interval;
            printf("(( swap interval: %i ))\n", swap_interval);
            glfwSwapInterval(swap_interval);
            break;

        case GLFW_KEY_W:
            wait_events = !wait_events;
            printf("(( %sing for events ))\n", wait_events ? "wait" : "poll");
            break;

        case GLFW_KEY_T:
            track_cursor = !track_cursor;
            if (track_cursor)
                glfwSetCursor(window, tracking_cursor);
            else
                glfwSetCursor(window, NULL);

            break;

        case GLFW_KEY_P:
        {
            double x, y;
            glfwGetCursorPos(window, &x, &y);

            printf("Query before set: %f %f (%+f %+f)\n",
                   x, y, x - cursor_x, y - cursor_y);
            cursor_x = x;
            cursor_y = y;

            glfwSetCursorPos(window, cursor_x, cursor_y);
            glfwGetCursorPos(window, &x, &y);

            printf("Query after set: %f %f (%+f %+f)\n",
                   x, y, x - cursor_x, y - cursor_y);
            cursor_x = x;
            cursor_y = y;
            break;
        }

        case GLFW_KEY_UP:
            glfwSetCursorPos(window, 0, 0);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;

        case GLFW_KEY_DOWN:
        {
            int width, height;
            glfwGetWindowSize(window, &width, &height);
            glfwSetCursorPos(window, width - 1, height - 1);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;
        }

        case GLFW_KEY_0:
            glfwSetCursor(window, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetCursor(window, standard_cursors[0]);
            break;

        case GLFW_KEY_2:
            glfwSetCursor(window, standard_cursors[1]);
            break;

        case GLFW_KEY_3:
            glfwSetCursor(window, standard_cursors[2]);
            break;

        case GLFW_KEY_4:
            glfwSetCursor(window, standard_cursors[3]);
            break;

        case GLFW_KEY_5:
            glfwSetCursor(window, standard_cursors[4]);
            break;

        case GLFW_KEY_6:
            glfwSetCursor(window, standard_cursors[5]);
            break;

        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            static int x, y, width, height;

            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
                glfwSetWindowMonitor(window, NULL, x, y, width, height, 0);
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                glfwGetWindowPos(window, &x, &y);
                glfwGetWindowSize(window, &width, &height);
                glfwSetWindowMonitor(window, monitor,
                                     0, 0, mode->width, mode->height,
                                     mode->refreshRate);
            }

            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;
        }
    }
}